

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
GeneratorProfile_trigonometricOperators_Test::TestBody
          (GeneratorProfile_trigonometricOperators_Test *this)

{
  char *pcVar1;
  AssertHelper local_70 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  GeneratorProfilePtr generatorProfile;
  string value;
  
  libcellml::GeneratorProfile::create((Profile)&generatorProfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"value",(allocator<char> *)&local_58);
  libcellml::GeneratorProfile::setSinString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCosString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setTanString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setSecString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCscString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCotString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setSinhString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCoshString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setTanhString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setSechString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCschString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setCothString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAsinString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcosString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAtanString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAsecString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcscString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcotString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAsinhString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcoshString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAtanhString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAsechString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcschString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAcothString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::sinString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->sinString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2c6,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::cosString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->cosString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2c7,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::tanString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->tanString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2c8,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::secString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->secString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2c9,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::cscString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->cscString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2ca,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::cotString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->cotString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2cb,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::sinhString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->sinhString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2cc,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::coshString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->coshString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2cd,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::tanhString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->tanhString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2ce,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::sechString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->sechString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2cf,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::cschString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->cschString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d0,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::cothString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->cothString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d1,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::asinString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->asinString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d2,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acosString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acosString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d3,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::atanString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->atanString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d4,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::asecString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->asecString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d5,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acscString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acscString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d6,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acotString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acotString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d7,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::asinhString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->asinhString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d8,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acoshString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acoshString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2d9,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::atanhString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->atanhString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2da,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::asechString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->asechString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2db,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acschString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acschString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2dc,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::acothString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->acothString()",&value,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x2dd,pcVar1);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generatorProfile.
              super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(GeneratorProfile, trigonometricOperators)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    const std::string value = "value";

    generatorProfile->setSinString(value);
    generatorProfile->setCosString(value);
    generatorProfile->setTanString(value);
    generatorProfile->setSecString(value);
    generatorProfile->setCscString(value);
    generatorProfile->setCotString(value);
    generatorProfile->setSinhString(value);
    generatorProfile->setCoshString(value);
    generatorProfile->setTanhString(value);
    generatorProfile->setSechString(value);
    generatorProfile->setCschString(value);
    generatorProfile->setCothString(value);
    generatorProfile->setAsinString(value);
    generatorProfile->setAcosString(value);
    generatorProfile->setAtanString(value);
    generatorProfile->setAsecString(value);
    generatorProfile->setAcscString(value);
    generatorProfile->setAcotString(value);
    generatorProfile->setAsinhString(value);
    generatorProfile->setAcoshString(value);
    generatorProfile->setAtanhString(value);
    generatorProfile->setAsechString(value);
    generatorProfile->setAcschString(value);
    generatorProfile->setAcothString(value);

    EXPECT_EQ(value, generatorProfile->sinString());
    EXPECT_EQ(value, generatorProfile->cosString());
    EXPECT_EQ(value, generatorProfile->tanString());
    EXPECT_EQ(value, generatorProfile->secString());
    EXPECT_EQ(value, generatorProfile->cscString());
    EXPECT_EQ(value, generatorProfile->cotString());
    EXPECT_EQ(value, generatorProfile->sinhString());
    EXPECT_EQ(value, generatorProfile->coshString());
    EXPECT_EQ(value, generatorProfile->tanhString());
    EXPECT_EQ(value, generatorProfile->sechString());
    EXPECT_EQ(value, generatorProfile->cschString());
    EXPECT_EQ(value, generatorProfile->cothString());
    EXPECT_EQ(value, generatorProfile->asinString());
    EXPECT_EQ(value, generatorProfile->acosString());
    EXPECT_EQ(value, generatorProfile->atanString());
    EXPECT_EQ(value, generatorProfile->asecString());
    EXPECT_EQ(value, generatorProfile->acscString());
    EXPECT_EQ(value, generatorProfile->acotString());
    EXPECT_EQ(value, generatorProfile->asinhString());
    EXPECT_EQ(value, generatorProfile->acoshString());
    EXPECT_EQ(value, generatorProfile->atanhString());
    EXPECT_EQ(value, generatorProfile->asechString());
    EXPECT_EQ(value, generatorProfile->acschString());
    EXPECT_EQ(value, generatorProfile->acothString());
}